

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgToken.hpp
# Opt level: O3

TokenStream * __thiscall rsg::TokenStream::operator<<(TokenStream *this,Token *token)

{
  pointer pTVar1;
  size_t sVar2;
  size_t sVar3;
  
  pTVar1 = (this->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = (long)(this->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)pTVar1 >> 4;
  sVar3 = this->m_numTokens;
  if (sVar2 == sVar3) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&this->m_tokens,sVar2 + 0x40);
    pTVar1 = (this->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = this->m_numTokens;
  }
  Token::operator=(pTVar1 + sVar3,token);
  this->m_numTokens = this->m_numTokens + 1;
  return this;
}

Assistant:

inline TokenStream& TokenStream::operator<< (const Token& token)
{
	if (m_tokens.size() == m_numTokens)
		m_tokens.resize(m_numTokens+ALLOC_SIZE);

	m_tokens[m_numTokens]	 = token;
	m_numTokens				+= 1;

	return *this;
}